

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int pager_create_header(Pager *pPager)

{
  Page *pPVar1;
  unqlite_kv_engine *puVar2;
  uchar *pDest;
  _func_int_unqlite_vfs_ptr_Sytm_ptr *p_Var3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  Page *pPage;
  ushort uVar8;
  uint uVar9;
  char *pcVar10;
  
  pPage = pager_alloc_page(pPager,0);
  if (pPage == (Page *)0x0) {
    iVar7 = -1;
  }
  else {
    pPager->pHeader = pPage;
    pager_link_page(pPager,pPage);
    if ((pPage->flags & 2U) == 0) {
      pPage->flags = pPage->flags | 0x26;
      pPage->pDirtyPrev = (Page *)0x0;
      pPVar1 = pPager->pDirty;
      pPage->pDirtyNext = pPVar1;
      if (pPVar1 != (Page *)0x0) {
        pPVar1->pDirtyPrev = pPage;
      }
      pPager->pDirty = pPage;
      if (pPager->pFirstDirty == (Page *)0x0) {
        pPager->pFirstDirty = pPage;
      }
    }
    puVar2 = pPager->pEngine;
    pDest = pPager->pHeader->zData;
    SyMemcpy("unqlite",pDest,7);
    pDest[7] = 0xdb;
    pDest[8] = '|';
    pDest[9] = '\'';
    pDest[10] = '\x12';
    (pPager->tmCreate).tm_sec = 0;
    (pPager->tmCreate).tm_min = 0;
    (pPager->tmCreate).tm_hour = 0;
    (pPager->tmCreate).tm_mday = 0;
    (pPager->tmCreate).tm_mon = 0;
    (pPager->tmCreate).tm_year = 0;
    (pPager->tmCreate).tm_wday = 0;
    (pPager->tmCreate).tm_yday = 0;
    *(undefined8 *)&(pPager->tmCreate).tm_isdst = 0;
    (pPager->tmCreate).tm_zone = (char *)0x0;
    (pPager->tmCreate).tm_gmtoff = 0;
    p_Var3 = pPager->pVfs->xCurrentTime;
    if (p_Var3 != (_func_int_unqlite_vfs_ptr_Sytm_ptr *)0x0) {
      (*p_Var3)(pPager->pVfs,&pPager->tmCreate);
    }
    uVar9 = ((pPager->tmCreate).tm_sec >> 1) +
            (pPager->tmCreate).tm_min * 0x20 + (pPager->tmCreate).tm_hour * 0x800;
    uVar6 = ((pPager->tmCreate).tm_mon * 0x20 + (pPager->tmCreate).tm_year * 0x200 +
            (pPager->tmCreate).tm_mday) * 0x10000 + 0x88000000U | uVar9;
    uVar8 = (ushort)uVar9;
    *(ushort *)(pDest + 0xd) = uVar8 << 8 | uVar8 >> 8;
    pDest[0xc] = (uchar)(uVar6 >> 0x10);
    pDest[0xb] = (uchar)(uVar6 >> 0x18);
    uVar6 = pPager->iSectorSize;
    *(uint *)(pDest + 0xf) =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar6 = pPager->iPageSize;
    *(uint *)(pDest + 0x13) =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    pcVar4 = puVar2->pIo->pMethods->zName;
    pcVar10 = pcVar4;
    if (*pcVar4 != '\0') {
      pcVar5 = pcVar4 + 2;
      do {
        pcVar10 = pcVar5;
        if (pcVar10[-1] == '\0') {
          pcVar10 = pcVar10 + -1;
          goto LAB_00141fc3;
        }
        if (*pcVar10 == '\0') goto LAB_00141fc3;
        if (pcVar10[1] == '\0') {
          pcVar10 = pcVar10 + 1;
          goto LAB_00141fc3;
        }
        pcVar5 = pcVar10 + 4;
      } while (pcVar10[2] != '\0');
      pcVar10 = pcVar10 + 2;
    }
LAB_00141fc3:
    uVar8 = (ushort)((long)pcVar10 - (long)pcVar4);
    *(ushort *)(pDest + 0x17) = uVar8 << 8 | uVar8 >> 8;
    SyMemcpy(puVar2->pIo->pMethods->zName,pDest + 0x19,(uint)((long)pcVar10 - (long)pcVar4) & 0xffff
            );
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int pager_create_header(Pager *pPager)
{
	Page *pHeader;
	int rc;
	/* Allocate a new page */
	pHeader = pager_alloc_page(pPager,0);
	if( pHeader == 0 ){
		return UNQLITE_NOMEM;
	}
	pPager->pHeader = pHeader;
	/* Link the page */
	pager_link_page(pPager,pHeader);
	/* Add to the dirty list */
	pager_page_to_dirty_list(pPager,pHeader);
	/* Write the database header */
	rc = pager_write_db_header(pPager);
	return rc;
}